

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::taylor_inplace_multiplier<double,_2,_2,_7,_0>::mul(double *p1,double *p2)

{
  int iVar1;
  int local_1c;
  int i;
  double *p2_local;
  double *p1_local;
  
  local_1c = binomial(3,1);
  while( true ) {
    iVar1 = binomial(4,2);
    if (iVar1 <= local_1c) break;
    p1[local_1c] = *p2 * p1[local_1c];
    local_1c = local_1c + 1;
  }
  taylor_inplace_multiplier<double,_2,_2,_7,_1>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
         i < binomial(Nvar + Ndeg, Ndeg);
         i++)
      p1[i] *= p2[0];
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, 1>::mul(
        p1, p2); // continue at (2)
  }